

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  SequenceNumber *__mutex;
  _Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  *p_Var1;
  pointer pOVar2;
  VersionSet *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  Logger *info_log;
  bool bVar6;
  int iVar7;
  long lVar8;
  Iterator *pIVar9;
  long lVar10;
  long lVar11;
  undefined4 extraout_var;
  uint64_t uVar12;
  undefined4 extraout_var_00;
  _func_int *p_Var13;
  long *plVar14;
  char *pcVar15;
  undefined8 uVar16;
  bool bVar17;
  long lVar18;
  Iterator *in_RDX;
  Env *extraout_RDX;
  Env *extraout_RDX_00;
  DB DVar19;
  uint uVar20;
  pointer *ppOVar21;
  TableBuilder *pTVar22;
  ulong uVar23;
  _func_int **pp_Var24;
  long lVar25;
  long in_FS_OFFSET;
  bool bVar26;
  Status *status;
  ParsedInternalKey ikey;
  LevelSummaryStorage tmp;
  string current_user_key;
  long local_118;
  DB local_f8;
  undefined1 local_f0 [48];
  undefined1 local_c0 [112];
  Env *pEStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  TableCache *local_38;
  
  local_38 = *(TableCache **)(in_FS_OFFSET + 0x28);
  lVar8 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  pp_Var24 = in_RDX->_vptr_Iterator;
  Log((Logger *)compact[1].smallest_snapshot,"Compacting %d@%d + %d@%d files",
      (ulong)((long)pp_Var24[0x19] - (long)pp_Var24[0x18]) >> 3,(ulong)*(uint *)pp_Var24,
      (ulong)((long)pp_Var24[0x1c] - (long)pp_Var24[0x1b]) >> 3,(ulong)(*(uint *)pp_Var24 + 1));
  iVar7 = VersionSet::NumLevelFiles((VersionSet *)compact[8].outfile,*(int *)in_RDX->_vptr_Iterator)
  ;
  if (iVar7 < 1) {
LAB_00d120dc:
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x381,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0) {
    __assert_fail("compact->builder == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x382,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1]._vptr_Iterator != (_func_int **)0x0) {
    __assert_fail("compact->outfile == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,899,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  pOVar2 = compact[7].outputs.
           super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (VersionSet *)compact[8].outfile;
  ppOVar21 = (pointer *)&(pOVar2->smallest).rep_._M_string_length;
  if (pOVar2 == (pointer)(compact + 7)) {
    ppOVar21 = (pointer *)&this_00->last_sequence_;
  }
  pp_Var24 = (_func_int **)0xffffffffffffff;
  (in_RDX->cleanup_head_).function = (CleanupFunction)*ppOVar21;
  pIVar9 = VersionSet::MakeInputIterator(this_00,(Compaction *)in_RDX->_vptr_Iterator);
  __mutex = &compact[3].smallest_snapshot;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  (*pIVar9->_vptr_Iterator[3])(pIVar9);
  bVar26 = false;
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_f0._16_8_ = "";
  local_f0._24_8_ = (Comparator *)0x0;
  local_c0._104_8_ = &local_48;
  pEStack_50 = (Env *)0x0;
  local_48._M_local_buf[0] = '\0';
  local_118 = 0;
  while ((iVar7 = (*pIVar9->_vptr_Iterator[2])(pIVar9), (char)iVar7 != '\0' &&
         (((ulong)compact[3].builder & 1) == 0))) {
    if (((ulong)compact[5].compaction & 1) != 0) {
      lVar10 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar7 != 0) {
        if (*(TableCache **)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00d1220a;
        std::__throw_system_error(iVar7);
        goto LAB_00d120dc;
      }
      if (compact[4].total_bytes != 0) {
        CompactMemTable((DBImpl *)compact);
        std::condition_variable::notify_all();
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      lVar11 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      local_118 = (local_118 - lVar10) + lVar11;
    }
    iVar7 = (*pIVar9->_vptr_Iterator[8])(pIVar9);
    local_c0._0_8_ = CONCAT44(extraout_var,iVar7);
    local_c0._8_8_ = extraout_RDX;
    bVar6 = Compaction::ShouldStopBefore((Compaction *)in_RDX->_vptr_Iterator,(Slice *)local_c0);
    if ((bVar6) && (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0)) {
      FinishCompactionOutputFile((DBImpl *)local_f0,compact,in_RDX);
      uVar16 = local_f0._0_8_;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_f0._0_8_;
      local_f0._0_8_ = paVar3;
      if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        operator_delete__(paVar3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar16 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_00d11ece;
    }
    if ((ulong)local_c0._8_8_ < (Env *)&DAT_00000008) {
LAB_00d11cf1:
      pEStack_50 = (Env *)0x0;
      *(char *)local_c0._104_8_ = '\0';
      bVar26 = false;
      pp_Var24 = (_func_int **)0xffffffffffffff;
LAB_00d11d14:
      pTVar22 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
      if (pTVar22 == (TableBuilder *)0x0) {
        OpenCompactionOutputFile((DBImpl *)local_f0,compact);
        uVar16 = local_f0._0_8_;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_f0._0_8_;
        local_f0._0_8_ = paVar3;
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
          operator_delete__(paVar3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar16 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_00d11ece;
        pTVar22 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
      }
      uVar12 = TableBuilder::NumEntries(pTVar22);
      if (uVar12 == 0) {
        pvVar5 = (in_RDX->cleanup_head_).arg2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)pvVar5 + -0x40),0,*(size_type *)((long)pvVar5 + -0x38),
                   (char *)local_c0._0_8_,local_c0._8_8_);
      }
      pvVar5 = (in_RDX->cleanup_head_).arg2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)pvVar5 + -0x20),0,*(size_type *)((long)pvVar5 + -0x18),
                 (char *)local_c0._0_8_,local_c0._8_8_);
      pTVar22 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
      iVar7 = (*pIVar9->_vptr_Iterator[9])(pIVar9);
      local_f0._0_8_ = CONCAT44(extraout_var_00,iVar7);
      local_f0._8_8_ = extraout_RDX_00;
      TableBuilder::Add(pTVar22,(Slice *)local_c0,(Slice *)local_f0);
      p_Var13 = (_func_int *)
                TableBuilder::FileSize((TableBuilder *)in_RDX[1].cleanup_head_.function);
      if (in_RDX->_vptr_Iterator[1] <= p_Var13) {
        FinishCompactionOutputFile((DBImpl *)local_f0,compact,in_RDX);
        uVar16 = local_f0._0_8_;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_f0._0_8_;
        local_f0._0_8_ = paVar3;
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
          operator_delete__(paVar3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar16 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_00d11ece;
      }
    }
    else {
      uVar23 = *(ulong *)((long)&((Comparator *)(local_c0._0_8_ + -8))->_vptr_Comparator +
                         local_c0._8_8_);
      local_f0._40_4_ = (uint)uVar23 & 0xff;
      local_f0._32_8_ = uVar23 >> 8;
      local_f0._24_8_ = local_c0._8_8_ + -8;
      local_f0._16_8_ = local_c0._0_8_;
      if (1 < (uint)local_f0._40_4_) goto LAB_00d11cf1;
      if (bVar26) {
        pOVar2 = (compact->outputs).
                 super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_f0._0_8_ = local_c0._104_8_;
        local_f0._8_8_ = pEStack_50;
        iVar7 = (**(code **)(pOVar2->number + 0x10))(pOVar2,local_f0 + 0x10,local_f0);
        if (iVar7 != 0) goto LAB_00d11ca4;
      }
      else {
LAB_00d11ca4:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_c0 + 0x68),0,(size_type)pEStack_50,(char *)local_f0._16_8_,local_f0._24_8_
                  );
        pp_Var24 = (_func_int **)0xffffffffffffff;
      }
      pp_Var4 = (_func_int **)(in_RDX->cleanup_head_).function;
      if (pp_Var4 < pp_Var24) {
        if (pp_Var4 < (ulong)local_f0._32_8_ || local_f0._40_4_ != 0) {
          bVar26 = true;
          pp_Var24 = (_func_int **)local_f0._32_8_;
        }
        else {
          bVar6 = Compaction::IsBaseLevelForKey
                            ((Compaction *)in_RDX->_vptr_Iterator,(Slice *)(local_f0 + 0x10));
          bVar26 = true;
          pp_Var24 = (_func_int **)local_f0._32_8_;
          if (bVar6) goto LAB_00d11e1c;
        }
        goto LAB_00d11d14;
      }
      bVar26 = true;
      pp_Var24 = (_func_int **)local_f0._32_8_;
    }
LAB_00d11e1c:
    (*pIVar9->_vptr_Iterator[6])(pIVar9);
  }
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    if (((ulong)compact[3].builder & 1) == 0) {
      DVar19._vptr_DB = (this->super_DB)._vptr_DB;
    }
    else {
      local_c0._0_8_ = "Deleting DB during compaction";
      local_c0._8_8_ = (Env *)0x1d;
      local_f0._0_8_ = "";
      local_f0._8_8_ = (Env *)0x0;
      Status::Status((Status *)&local_f8,kIOError,(Slice *)local_c0,(Slice *)local_f0);
      DVar19._vptr_DB = local_f8._vptr_DB;
      pp_Var24 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = local_f8._vptr_DB;
      local_f8._vptr_DB = pp_Var24;
      if (pp_Var24 != (_func_int **)0x0) {
        operator_delete__(pp_Var24);
      }
    }
    if (DVar19._vptr_DB != (_func_int **)0x0) goto LAB_00d11ece;
    if (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0) {
      FinishCompactionOutputFile((DBImpl *)local_c0,compact,in_RDX);
      (this->super_DB)._vptr_DB = (_func_int **)local_c0._0_8_;
      if ((Comparator *)local_c0._0_8_ != (Comparator *)0x0) goto LAB_00d11ece;
    }
    (*pIVar9->_vptr_Iterator[10])(local_c0,pIVar9);
    (this->super_DB)._vptr_DB = (_func_int **)local_c0._0_8_;
    bVar26 = (Comparator *)local_c0._0_8_ == (Comparator *)0x0;
  }
  else {
LAB_00d11ece:
    bVar26 = false;
  }
  (*pIVar9->_vptr_Iterator[1])(pIVar9);
  lVar10 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  lVar11 = 0;
  lVar25 = 0;
  bVar6 = true;
  do {
    bVar17 = bVar6;
    p_Var13 = in_RDX->_vptr_Iterator[lVar11 * 3 + 0x18];
    uVar20 = (uint)((ulong)((long)in_RDX->_vptr_Iterator[lVar11 * 3 + 0x19] - (long)p_Var13) >> 3);
    if (0 < (int)uVar20) {
      uVar23 = 0;
      do {
        lVar25 = lVar25 + *(long *)(*(long *)(p_Var13 + uVar23 * 8) + 0x10);
        uVar23 = uVar23 + 1;
      } while ((uVar20 & 0x7fffffff) != uVar23);
    }
    lVar11 = 1;
    bVar6 = false;
  } while (bVar17);
  pvVar5 = (in_RDX->cleanup_head_).arg1;
  lVar11 = (long)(in_RDX->cleanup_head_).arg2 - (long)pvVar5;
  if (lVar11 == 0) {
    lVar11 = 0;
  }
  else {
    lVar18 = (lVar11 >> 4) * -0x3333333333333333;
    lVar18 = lVar18 + (ulong)(lVar18 == 0);
    plVar14 = (long *)((long)pvVar5 + 8);
    lVar11 = 0;
    do {
      lVar11 = lVar11 + *plVar14;
      plVar14 = plVar14 + 10;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar7 != 0) {
    if (*(TableCache **)(in_FS_OFFSET + 0x28) == local_38) {
      uVar16 = std::__throw_system_error(iVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._104_8_ != &local_48) {
        operator_delete((void *)local_c0._104_8_,
                        CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
        ;
      }
      pp_Var24 = (this->super_DB)._vptr_DB;
      if (pp_Var24 != (_func_int **)0x0) {
        operator_delete__(pp_Var24);
      }
      if (*(TableCache **)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar16);
      }
    }
    goto LAB_00d1220a;
  }
  iVar7 = *(int *)in_RDX->_vptr_Iterator;
  p_Var1 = &(&compact[9].outputs)[iVar7].
            super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  ;
  (p_Var1->_M_impl).super__Vector_impl_data._M_start =
       (pointer)((long)(p_Var1->_M_impl).super__Vector_impl_data._M_start +
                (lVar10 - (local_118 + lVar8)));
  ppOVar21 = &(&compact[9].outputs)[iVar7].
              super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *ppOVar21 = (pointer)((long)&(*ppOVar21)->number + lVar25);
  ppOVar21 = &(&compact[9].outputs)[iVar7].
              super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *ppOVar21 = (pointer)((long)&(*ppOVar21)->number + lVar11);
  if (bVar26) {
    InstallCompactionResults((DBImpl *)local_c0,compact);
    (this->super_DB)._vptr_DB = (_func_int **)local_c0._0_8_;
    if ((Comparator *)local_c0._0_8_ != (Comparator *)0x0) goto LAB_00d11fde;
  }
  else {
LAB_00d11fde:
    RecordBackgroundError((DBImpl *)compact,(Status *)this);
  }
  info_log = (Logger *)compact[1].smallest_snapshot;
  pcVar15 = VersionSet::LevelSummary
                      ((VersionSet *)compact[8].outfile,(LevelSummaryStorage *)local_c0);
  Log(info_log,"compacted to: %s",pcVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._104_8_ != &local_48) {
    operator_delete((void *)local_c0._104_8_,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  if (*(TableCache **)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
LAB_00d1220a:
  __stack_chk_fail();
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState* compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder == nullptr);
  assert(compact->outfile == nullptr);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->sequence_number();
  }

  Iterator* input = versions_->MakeInputIterator(compact->compaction);

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  while (input->Valid() && !shutting_down_.load(std::memory_order_acquire)) {
    // Prioritize immutable compaction work
    if (has_imm_.load(std::memory_order_relaxed)) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_ != nullptr) {
        CompactMemTable();
        // Wake up MakeRoomForWrite() if necessary.
        background_work_finished_signal_.SignalAll();
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder != nullptr) {
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key, Slice(current_user_key)) !=
              0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;  // (A)
      } else if (ikey.type == kTypeDeletion &&
                 ikey.sequence <= compact->smallest_snapshot &&
                 compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder == nullptr) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries() == 0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.load(std::memory_order_acquire)) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder != nullptr) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = nullptr;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log, "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}